

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O2

void __thiscall
cppmetrics::ExponentiallyDecayingReservoir::ExponentiallyDecayingReservoir
          (ExponentiallyDecayingReservoir *this,ExponentiallyDecayingReservoir *other)

{
  _Rb_tree_header *p_Var1;
  time_t tVar2;
  
  (this->super_Reservoir)._vptr_Reservoir =
       (_func_int **)&PTR__ExponentiallyDecayingReservoir_0012b8c8;
  (this->m_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_samples)._M_t._M_impl.super__Rb_tree_header;
  (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::mutex::lock(&other->m_mutex);
  LOCK();
  (this->m_count).super___atomic_base<long>._M_i = (other->m_count).super___atomic_base<long>._M_i;
  UNLOCK();
  this->m_clock = other->m_clock;
  tVar2 = other->m_next_rescale_time;
  this->m_start = other->m_start;
  this->m_next_rescale_time = tVar2;
  this->m_size = other->m_size;
  this->m_alpha = other->m_alpha;
  std::
  _Rb_tree<double,_std::pair<const_double,_cppmetrics::WeightedSample>,_std::_Select1st<std::pair<const_double,_cppmetrics::WeightedSample>_>,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
  ::operator=(&(this->m_samples)._M_t,&(other->m_samples)._M_t);
  LOCK();
  (other->m_count).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  other->m_next_rescale_time = 0;
  other->m_size = 0;
  other->m_clock = (Clock *)0x0;
  other->m_start = 0;
  other->m_alpha = 0.0;
  pthread_mutex_unlock((pthread_mutex_t *)&other->m_mutex);
  return;
}

Assistant:

ExponentiallyDecayingReservoir::ExponentiallyDecayingReservoir(ExponentiallyDecayingReservoir&& other)
{
  std::lock_guard<std::mutex> lock(other.m_mutex);

  m_count.store(other.m_count.load());
  m_clock = other.m_clock;
  m_start = other.m_start;
  m_next_rescale_time = other.m_next_rescale_time;
  m_size = other.m_size;
  m_alpha = other.m_alpha;
  m_samples = std::move(other.m_samples);

  other.m_count.store(0);
  other.m_clock = nullptr;
  other.m_start = 0;
  other.m_next_rescale_time = 0;
  other.m_size = 0;
  other.m_alpha = 0.0;
  // other.m_samples is already moved
}